

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::mapsucks_cmd(int cid,char **args,int argc)

{
  int iVar1;
  int iVar2;
  clientinfo *ci;
  char *pcVar3;
  
  iVar1 = QServ::getSender(&qs);
  ci = QServ::getClient(&qs,iVar1);
  if (ci->votedmapsucks == false) {
    mapsucksvotes = mapsucksvotes + 1;
    pcVar3 = colorname(ci);
    out(3,
        "\f0%s \f7thinks this map sucks, use \f2#mapsucks \f7to vote for an intermission to skip it."
        ,pcVar3);
    ci->votedmapsucks = true;
    iVar1 = mapsucksvotes;
    iVar2 = getvar((char *)0x156030);
    if (iVar2 <= iVar1) {
      startintermission();
      out(3,"\f7Changing map: That map sucked (\f7%d \f7votes to skip)",(ulong)votestopassmapsucks);
      iVar1 = mapsucksvotes;
      iVar2 = getvar((char *)0x156064);
      if (iVar2 <= iVar1) {
        do {
          mapsucksvotes = 0;
          out(3,"\f7Clearing votes...");
          iVar1 = mapsucksvotes;
          iVar2 = getvar((char *)0x15609d);
        } while (iVar2 <= iVar1);
      }
    }
    return;
  }
  sendf(ci->clientnum,1,"ris",0x23,"\f3Error: You have already voted");
  return;
}

Assistant:

QSERV_CALLBACK mapsucks_cmd(p) {
        clientinfo *ci = qs.getClient(CMD_SENDER);
        if(!ci->votedmapsucks) {
            mapsucksvotes++;
            out(ECHO_SERV, "\f0%s \f7thinks this map sucks, use \f2#mapsucks \f7to vote for an intermission to skip it.", colorname(ci));
            ci->votedmapsucks = true;
            if(mapsucksvotes>=getvar("votestopassmapsucks")) {
                startintermission();
                out(ECHO_SERV, "\f7Changing map: That map sucked (\f7%d \f7votes to skip)", votestopassmapsucks);
                while(mapsucksvotes>=getvar("votestopassmapsucks")) {
                    mapsucksvotes = 0;
                    out(ECHO_SERV,"\f7Clearing votes...");
                }
            }
        }
        else if(ci->votedmapsucks) sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: You have already voted");
    }